

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osh_filesystem.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  directory_entry *this;
  path *ppVar4;
  path local_f8 [32];
  path local_d8 [32];
  directory_iterator local_b8 [8];
  directory_iterator end;
  path local_90 [32];
  directory_iterator local_70 [8];
  directory_iterator it;
  path local_38 [32];
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  if ((argc == 2) && (iVar2 = strcmp(argv[1],"pwd"), iVar2 == 0)) {
    Omega_h::filesystem::current_path();
    poVar3 = (ostream *)Omega_h::filesystem::operator<<((ostream *)&std::cout,local_38);
    std::operator<<(poVar3,'\n');
    Omega_h::filesystem::path::~path(local_38);
  }
  else if (((int)argv_local == 2) && (iVar2 = strcmp(local_18[1],"ls"), iVar2 == 0)) {
    Omega_h::filesystem::current_path();
    Omega_h::filesystem::directory_iterator::directory_iterator(local_70,local_90);
    Omega_h::filesystem::path::~path(local_90);
    Omega_h::filesystem::directory_iterator::directory_iterator(local_b8);
    while (bVar1 = Omega_h::filesystem::operator!=(local_70,local_b8), bVar1) {
      this = (directory_entry *)Omega_h::filesystem::directory_iterator::operator->(local_70);
      ppVar4 = Omega_h::filesystem::directory_entry::path(this);
      poVar3 = (ostream *)Omega_h::filesystem::operator<<((ostream *)&std::cout,ppVar4);
      std::operator<<(poVar3,'\n');
      Omega_h::filesystem::directory_iterator::operator++(local_70);
    }
    Omega_h::filesystem::directory_iterator::~directory_iterator(local_b8);
    Omega_h::filesystem::directory_iterator::~directory_iterator(local_70);
  }
  else if (((int)argv_local == 3) && (iVar2 = strcmp(local_18[1],"rm"), iVar2 == 0)) {
    Omega_h::filesystem::path::path(local_d8,local_18[2]);
    Omega_h::filesystem::remove(local_d8);
    Omega_h::filesystem::path::~path(local_d8);
  }
  else if ((((int)argv_local == 4) && (iVar2 = strcmp(local_18[1],"rm"), iVar2 == 0)) &&
          (iVar2 = strcmp(local_18[2],"-r"), iVar2 == 0)) {
    Omega_h::filesystem::path::path(local_f8,local_18[3]);
    Omega_h::filesystem::remove_all(local_f8);
    Omega_h::filesystem::path::~path(local_f8);
  }
  else {
    std::operator<<((ostream *)&std::cout,"usage: osh_filesystem pwd\n");
    std::operator<<((ostream *)&std::cout,"       osh_filesystem ls\n");
    std::operator<<((ostream *)&std::cout,"       osh_filesystem rm <file>\n");
    std::operator<<((ostream *)&std::cout,"       osh_filesystem rm -r <dir>\n");
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  if (argc == 2 && 0 == strcmp(argv[1], "pwd")) {
    std::cout << Omega_h::filesystem::current_path() << '\n';
  } else if (argc == 2 && 0 == strcmp(argv[1], "ls")) {
    for (Omega_h::filesystem::directory_iterator
             it(Omega_h::filesystem::current_path()),
         end;
         it != end; ++it) {
      std::cout << it->path() << '\n';
    }
  } else if (argc == 3 && 0 == strcmp(argv[1], "rm")) {
    Omega_h::filesystem::remove(argv[2]);
  } else if (argc == 4 && 0 == strcmp(argv[1], "rm") &&
             0 == strcmp(argv[2], "-r")) {
    Omega_h::filesystem::remove_all(argv[3]);
  } else {
    std::cout << "usage: osh_filesystem pwd\n";
    std::cout << "       osh_filesystem ls\n";
    std::cout << "       osh_filesystem rm <file>\n";
    std::cout << "       osh_filesystem rm -r <dir>\n";
  }
}